

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_buffer_pool.cpp
# Opt level: O1

int __thiscall
libtorrent::disk_buffer_pool::allocate_iovec
          (disk_buffer_pool *this,span<libtorrent::span<char>_> iov)

{
  void *__ptr;
  mutex_type *pmVar1;
  long lVar2;
  char *extraout_RDX;
  char *pcVar3;
  char *extraout_RDX_00;
  unique_lock<std::mutex> *puVar4;
  unique_lock<std::mutex> *l_00;
  long lVar5;
  unique_lock<std::mutex> *puVar6;
  bool bVar7;
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> local_40;
  
  lVar2 = iov.m_len;
  puVar4 = (unique_lock<std::mutex> *)iov.m_ptr;
  local_40._M_device = &this->m_pool_mutex;
  local_40._M_owns = false;
  l_00 = puVar4;
  std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  bVar7 = lVar2 != 0;
  if (bVar7) {
    pcVar3 = extraout_RDX;
    puVar6 = puVar4;
    do {
      pmVar1 = (mutex_type *)allocate_buffer_impl(this,l_00,pcVar3);
      puVar6->_M_device = pmVar1;
      *(undefined8 *)&puVar6->_M_owns = 0x4000;
      if (pmVar1 == (mutex_type *)0x0) {
        lVar5 = 0;
        goto LAB_0032efc5;
      }
      puVar6 = puVar6 + 1;
      bVar7 = puVar6 != puVar4 + lVar2;
      pcVar3 = extraout_RDX_00;
    } while (bVar7);
  }
  goto LAB_0032efdf;
  while( true ) {
    free(__ptr);
    this->m_in_use = this->m_in_use + -1;
    lVar5 = lVar5 + 0x10;
    if (lVar2 * 0x10 == lVar5) break;
LAB_0032efc5:
    __ptr = *(void **)((long)&puVar4->_M_device + lVar5);
    if (__ptr == (void *)0x0) break;
  }
LAB_0032efdf:
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return -(uint)bVar7;
}

Assistant:

int disk_buffer_pool::allocate_iovec(span<iovec_t> iov)
	{
		std::unique_lock<std::mutex> l(m_pool_mutex);
		for (auto& i : iov)
		{
			i = { allocate_buffer_impl(l, "pending read"), std::size_t(default_block_size)};
			if (i.data() == nullptr)
			{
				// uh oh. We failed to allocate the buffer!
				// we need to roll back and free all the buffers
				// we've already allocated
				for (auto j : iov)
				{
					if (j.data() == nullptr) break;
					char* buf = j.data();
					TORRENT_ASSERT(is_disk_buffer(buf, l));
					remove_buffer_in_use(buf);
					free_buffer_impl(buf, l);
				}
				return -1;
			}
		}
		return 0;
	}